

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesNode::Compute_inc_invMb_v
          (ChVariablesNode *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  PointerType pdVar7;
  ulong *puVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  lVar4 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar9 = (*(this->super_ChVariables)._vptr_ChVariables[2])();
  if (lVar4 != iVar9) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesNode.cpp"
                  ,0x34,
                  "virtual void chrono::ChVariablesNode::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar4 = *(long *)&(result->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  iVar9 = (*(this->super_ChVariables)._vptr_ChVariables[2])(this);
  if (lVar4 != iVar9) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesNode.cpp"
                  ,0x35,
                  "virtual void chrono::ChVariablesNode::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  uVar5 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (0 < (long)uVar5) {
    uVar6 = *(ulong *)&(result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
    if (0 < (long)uVar6) {
      pdVar7 = (vect->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_data;
      puVar8 = *(ulong **)
                &result->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      auVar10._0_8_ = 1.0 / this->mass;
      auVar10._8_8_ = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *pdVar7;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar8;
      auVar1 = vfmadd213sd_fma(auVar11,auVar10,auVar1);
      *puVar8 = auVar1._0_8_;
      if (uVar5 == 1) goto LAB_007e27b7;
      if (uVar6 != 1) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = pdVar7[1];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = puVar8[1];
        auVar1 = vfmadd213sd_fma(auVar12,auVar10,auVar2);
        puVar8[1] = auVar1._0_8_;
        if (uVar5 < 3) goto LAB_007e27b7;
        if (2 < uVar6) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pdVar7[2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = puVar8[2];
          auVar1 = vfmadd213sd_fma(auVar13,auVar10,auVar3);
          puVar8[2] = auVar1._0_8_;
          return;
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007e27b7:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesNode::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    double inv_mass = 1.0 / mass;
    result(0) += inv_mass * vect(0);
    result(1) += inv_mass * vect(1);
    result(2) += inv_mass * vect(2);
}